

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O1

int main(void)

{
  byte *pbVar1;
  ushort *puVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char s [19];
  char *stack [64];
  byte local_248;
  byte bStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  char cStack_238;
  char cStack_237;
  byte abStack_236 [14];
  undefined8 local_228 [64];
  
  pbVar5 = abStack_236;
  local_248 = 0x73;
  bStack_247 = 0x68;
  cStack_246 = 'r';
  cStack_245 = 'e';
  cStack_244 = 'i';
  cStack_243 = 'c';
  cStack_242 = 'n';
  cStack_241 = 'y';
  cStack_240 = 'j';
  cStack_23f = 'q';
  cStack_23e = 'p';
  cStack_23d = 'v';
  cStack_23c = 'o';
  cStack_23b = 'z';
  cStack_23a = 'x';
  cStack_239 = 'm';
  cStack_238 = 'b';
  cStack_237 = 't';
  abStack_236[0] = 0;
  pbVar4 = &local_248;
  pbVar9 = pbVar5;
  puVar6 = local_228;
LAB_00102460:
  do {
    pbVar8 = pbVar4 + 1;
    puVar7 = puVar6;
    while (7 < (ulong)((long)pbVar9 - (long)pbVar4)) {
      uVar10 = (ulong)((long)pbVar9 - (long)pbVar4) >> 1;
      bVar3 = pbVar4[uVar10];
      pbVar4[uVar10] = *pbVar4;
      *pbVar4 = bVar3;
      pbVar12 = pbVar9 + -1;
      if (pbVar9[-1] < pbVar4[1]) {
        bVar3 = *pbVar8;
        *pbVar8 = *pbVar12;
        *pbVar12 = bVar3;
      }
      if (*pbVar12 < *pbVar4) {
        bVar3 = *pbVar4;
        *pbVar4 = *pbVar12;
        *pbVar12 = bVar3;
      }
      pbVar13 = pbVar8;
      pbVar11 = pbVar4;
      if (pbVar4[1] <= *pbVar4) goto LAB_001024d7;
      do {
        bVar3 = *pbVar13;
        *pbVar13 = *pbVar11;
        *pbVar11 = bVar3;
LAB_001024d7:
        lVar14 = (long)pbVar9 - (long)pbVar13;
        pbVar11 = pbVar13;
        do {
          pbVar13 = pbVar11 + 1;
          lVar14 = lVar14 + -1;
          pbVar1 = pbVar11 + 1;
          pbVar11 = pbVar13;
        } while (*pbVar1 < *pbVar4);
        lVar16 = (long)pbVar12 - (long)pbVar4;
        pbVar11 = pbVar12;
        do {
          pbVar12 = pbVar11 + -1;
          lVar16 = lVar16 + -1;
          pbVar1 = pbVar11 + -1;
          pbVar11 = pbVar12;
        } while (*pbVar4 < *pbVar1);
      } while (pbVar13 <= pbVar12);
      bVar3 = *pbVar4;
      *pbVar4 = *pbVar12;
      *pbVar12 = bVar3;
      puVar6 = puVar7 + 2;
      if (lVar14 < lVar16) {
        *puVar7 = pbVar4;
        puVar7[1] = pbVar12;
        pbVar4 = pbVar13;
        goto LAB_00102460;
      }
      *puVar7 = pbVar13;
      puVar7[1] = pbVar9;
      pbVar9 = pbVar12;
      puVar7 = puVar6;
    }
    pbVar8 = pbVar4 + 1;
    if (pbVar8 < pbVar9) {
      lVar14 = 0;
      do {
        if (pbVar4[1] < *pbVar4) {
          lVar16 = 0;
          do {
            puVar2 = (ushort *)(pbVar4 + lVar16);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            if (lVar14 == lVar16) break;
            lVar15 = lVar16 + -1;
            pbVar12 = pbVar4 + lVar16;
            lVar16 = lVar16 + -1;
          } while (*pbVar12 < pbVar4[lVar15]);
        }
        pbVar8 = pbVar8 + 1;
        pbVar4 = pbVar4 + 1;
        lVar14 = lVar14 + -1;
      } while (pbVar8 < pbVar9);
    }
    if (puVar7 == local_228) {
      auVar21[0] = -(cStack_245 == 'h');
      auVar21[1] = -(cStack_244 == 'i');
      auVar21[2] = -(cStack_243 == 'j');
      auVar21[3] = -(cStack_242 == 'm');
      auVar21[4] = -(cStack_241 == 'n');
      auVar21[5] = -(cStack_240 == 'o');
      auVar21[6] = -(cStack_23f == 'p');
      auVar21[7] = -(cStack_23e == 'q');
      auVar21[8] = -(cStack_23d == 'r');
      auVar21[9] = -(cStack_23c == 's');
      auVar21[10] = -(cStack_23b == 't');
      auVar21[0xb] = -(cStack_23a == 'v');
      auVar21[0xc] = -(cStack_239 == 'x');
      auVar21[0xd] = -(cStack_238 == 'y');
      auVar21[0xe] = -(cStack_237 == 'z');
      auVar21[0xf] = -(abStack_236[0] == '\0');
      auVar17[0] = -(local_248 == 'b');
      auVar17[1] = -(bStack_247 == 'c');
      auVar17[2] = -(cStack_246 == 'e');
      auVar17[3] = -(cStack_245 == 'h');
      auVar17[4] = -(cStack_244 == 'i');
      auVar17[5] = -(cStack_243 == 'j');
      auVar17[6] = -(cStack_242 == 'm');
      auVar17[7] = -(cStack_241 == 'n');
      auVar17[8] = -(cStack_240 == 'o');
      auVar17[9] = -(cStack_23f == 'p');
      auVar17[10] = -(cStack_23e == 'q');
      auVar17[0xb] = -(cStack_23d == 'r');
      auVar17[0xc] = -(cStack_23c == 's');
      auVar17[0xd] = -(cStack_23b == 't');
      auVar17[0xe] = -(cStack_23a == 'v');
      auVar17[0xf] = -(cStack_239 == 'x');
      auVar17 = auVar17 & auVar21;
      if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
               ,0xaa,"strcmp( s, sorted1 ) == 0");
      }
      local_248 = 0x73;
      bStack_247 = 0x68;
      cStack_246 = 'r';
      cStack_245 = 'e';
      cStack_244 = 'i';
      cStack_243 = 'c';
      cStack_242 = 'n';
      cStack_241 = 'y';
      cStack_240 = 'j';
      cStack_23f = 'q';
      cStack_23e = 'p';
      cStack_23d = 'v';
      cStack_23c = 'o';
      cStack_23b = 'z';
      cStack_23a = 'x';
      cStack_239 = 'm';
      cStack_238 = 'b';
      cStack_237 = 't';
      abStack_236[0] = 0;
      pbVar4 = &local_248;
      puVar6 = local_228;
LAB_001025fe:
      do {
        pbVar9 = pbVar4 + 2;
        puVar7 = puVar6;
        while (pbVar8 = pbVar4, 0xe < (ulong)((long)pbVar5 - (long)pbVar4)) {
          uVar10 = (ulong)((long)pbVar5 - (long)pbVar4) >> 2;
          lVar14 = 0;
          do {
            bVar3 = pbVar4[lVar14 + uVar10 * 2];
            pbVar4[lVar14 + uVar10 * 2] = pbVar4[lVar14];
            pbVar4[lVar14] = bVar3;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 2);
          pbVar8 = pbVar5 + -2;
          if (pbVar5[-2] < *pbVar9) {
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              pbVar9[lVar14] = pbVar8[lVar14];
              pbVar8[lVar14] = bVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 2);
          }
          if (*pbVar8 < *pbVar4) {
            lVar14 = 0;
            do {
              bVar3 = pbVar4[lVar14];
              pbVar4[lVar14] = pbVar8[lVar14];
              pbVar8[lVar14] = bVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 2);
          }
          pbVar12 = pbVar9;
          if (*pbVar4 < pbVar4[2]) {
            lVar14 = 0;
            do {
              bVar3 = pbVar9[lVar14];
              pbVar9[lVar14] = pbVar4[lVar14];
              pbVar4[lVar14] = bVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 2);
          }
          while( true ) {
            lVar14 = (long)pbVar5 - (long)pbVar12;
            pbVar13 = pbVar12;
            do {
              pbVar12 = pbVar13 + 2;
              lVar14 = lVar14 + -2;
              pbVar11 = pbVar13 + 2;
              pbVar13 = pbVar12;
            } while (*pbVar11 < *pbVar4);
            lVar16 = (long)pbVar8 - (long)pbVar4;
            pbVar13 = pbVar8;
            do {
              pbVar8 = pbVar13 + -2;
              lVar16 = lVar16 + -2;
              pbVar11 = pbVar13 + -2;
              pbVar13 = pbVar8;
            } while (*pbVar4 < *pbVar11);
            if (pbVar8 < pbVar12) break;
            lVar14 = 0;
            do {
              bVar3 = pbVar12[lVar14];
              pbVar12[lVar14] = pbVar8[lVar14];
              pbVar8[lVar14] = bVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 2);
          }
          lVar15 = 0;
          do {
            bVar3 = pbVar4[lVar15];
            pbVar4[lVar15] = pbVar8[lVar15];
            pbVar8[lVar15] = bVar3;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 2);
          puVar6 = puVar7 + 2;
          if (lVar14 < lVar16) {
            *puVar7 = pbVar4;
            puVar7[1] = pbVar8;
            pbVar4 = pbVar12;
            goto LAB_001025fe;
          }
          *puVar7 = pbVar12;
          puVar7[1] = pbVar5;
          pbVar5 = pbVar8;
          puVar7 = puVar6;
        }
LAB_00102747:
        pbVar9 = pbVar8;
        pbVar8 = pbVar9 + 2;
        if (pbVar8 < pbVar5) {
          pbVar12 = pbVar8;
          if (pbVar9[2] < *pbVar9) {
            do {
              lVar14 = 0;
              do {
                bVar3 = pbVar12[lVar14 + -2];
                pbVar12[lVar14 + -2] = pbVar12[lVar14];
                pbVar12[lVar14] = bVar3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 2);
              if (pbVar9 == pbVar4) break;
              pbVar13 = pbVar9 + -2;
              bVar3 = *pbVar9;
              pbVar9 = pbVar9 + -2;
              pbVar12 = pbVar12 + -2;
            } while (bVar3 < *pbVar13);
          }
          goto LAB_00102747;
        }
        if (puVar7 == local_228) {
          auVar22[0] = -(cStack_245 == 'c');
          auVar22[1] = -(cStack_244 == 'j');
          auVar22[2] = -(cStack_243 == 'q');
          auVar22[3] = -(cStack_242 == 'n');
          auVar22[4] = -(cStack_241 == 'y');
          auVar22[5] = -(cStack_240 == 'o');
          auVar22[6] = -(cStack_23f == 'z');
          auVar22[7] = -(cStack_23e == 'p');
          auVar22[8] = -(cStack_23d == 'v');
          auVar22[9] = -(cStack_23c == 'r');
          auVar22[10] = -(cStack_23b == 'e');
          auVar22[0xb] = -(cStack_23a == 's');
          auVar22[0xc] = -(cStack_239 == 'h');
          auVar22[0xd] = -(cStack_238 == 'x');
          auVar22[0xe] = -(cStack_237 == 'm');
          auVar22[0xf] = -(abStack_236[0] == '\0');
          auVar18[0] = -(local_248 == 0x62);
          auVar18[1] = -(bStack_247 == 0x74);
          auVar18[2] = -(cStack_246 == 'i');
          auVar18[3] = -(cStack_245 == 'c');
          auVar18[4] = -(cStack_244 == 'j');
          auVar18[5] = -(cStack_243 == 'q');
          auVar18[6] = -(cStack_242 == 'n');
          auVar18[7] = -(cStack_241 == 'y');
          auVar18[8] = -(cStack_240 == 'o');
          auVar18[9] = -(cStack_23f == 'z');
          auVar18[10] = -(cStack_23e == 'p');
          auVar18[0xb] = -(cStack_23d == 'v');
          auVar18[0xc] = -(cStack_23c == 'r');
          auVar18[0xd] = -(cStack_23b == 'e');
          auVar18[0xe] = -(cStack_23a == 's');
          auVar18[0xf] = -(cStack_239 == 'h');
          auVar18 = auVar18 & auVar22;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
            TEST_RESULTS = TEST_RESULTS + 1;
            printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
                   ,0xad,"strcmp( s, sorted2 ) == 0");
          }
          pbVar5 = &bStack_247;
          local_248 = 0x73;
          bStack_247 = 0x68;
          cStack_246 = 'r';
          cStack_245 = 'e';
          cStack_244 = 'i';
          cStack_243 = 'c';
          cStack_242 = 'n';
          cStack_241 = 'y';
          cStack_240 = 'j';
          cStack_23f = 'q';
          cStack_23e = 'p';
          cStack_23d = 'v';
          cStack_23c = 'o';
          cStack_23b = 'z';
          cStack_23a = 'x';
          cStack_239 = 'm';
          cStack_238 = 'b';
          cStack_237 = 't';
          abStack_236[0] = 0;
          pbVar4 = &local_248;
          puVar6 = local_228;
LAB_0010282c:
          do {
            pbVar9 = pbVar4 + 1;
            puVar7 = puVar6;
            while (7 < (ulong)((long)pbVar5 - (long)pbVar4)) {
              uVar10 = (ulong)((long)pbVar5 - (long)pbVar4) >> 1;
              bVar3 = pbVar4[uVar10];
              pbVar4[uVar10] = *pbVar4;
              *pbVar4 = bVar3;
              pbVar8 = pbVar5 + -1;
              if (pbVar5[-1] < pbVar4[1]) {
                bVar3 = *pbVar9;
                *pbVar9 = *pbVar8;
                *pbVar8 = bVar3;
              }
              if (*pbVar8 < *pbVar4) {
                bVar3 = *pbVar4;
                *pbVar4 = *pbVar8;
                *pbVar8 = bVar3;
              }
              pbVar12 = pbVar9;
              pbVar13 = pbVar4;
              if (pbVar4[1] <= *pbVar4) goto LAB_001028a1;
              do {
                bVar3 = *pbVar12;
                *pbVar12 = *pbVar13;
                *pbVar13 = bVar3;
LAB_001028a1:
                lVar14 = (long)pbVar5 - (long)pbVar12;
                pbVar13 = pbVar12;
                do {
                  pbVar12 = pbVar13 + 1;
                  lVar14 = lVar14 + -1;
                  pbVar11 = pbVar13 + 1;
                  pbVar13 = pbVar12;
                } while (*pbVar11 < *pbVar4);
                lVar16 = (long)pbVar8 - (long)pbVar4;
                pbVar13 = pbVar8;
                do {
                  pbVar8 = pbVar13 + -1;
                  lVar16 = lVar16 + -1;
                  pbVar11 = pbVar13 + -1;
                  pbVar13 = pbVar8;
                } while (*pbVar4 < *pbVar11);
              } while (pbVar12 <= pbVar8);
              bVar3 = *pbVar4;
              *pbVar4 = *pbVar8;
              *pbVar8 = bVar3;
              puVar6 = puVar7 + 2;
              if (lVar14 < lVar16) {
                *puVar7 = pbVar4;
                puVar7[1] = pbVar8;
                pbVar4 = pbVar12;
                goto LAB_0010282c;
              }
              *puVar7 = pbVar12;
              puVar7[1] = pbVar5;
              pbVar5 = pbVar8;
              puVar7 = puVar6;
            }
            pbVar9 = pbVar4 + 1;
            if (pbVar9 < pbVar5) {
              lVar14 = 0;
              do {
                if (pbVar4[1] < *pbVar4) {
                  lVar16 = 0;
                  do {
                    puVar2 = (ushort *)(pbVar4 + lVar16);
                    *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
                    if (lVar14 == lVar16) break;
                    lVar15 = lVar16 + -1;
                    pbVar8 = pbVar4 + lVar16;
                    lVar16 = lVar16 + -1;
                  } while (*pbVar8 < pbVar4[lVar15]);
                }
                pbVar9 = pbVar9 + 1;
                pbVar4 = pbVar4 + 1;
                lVar14 = lVar14 + -1;
              } while (pbVar9 < pbVar5);
            }
            if (puVar7 == local_228) {
              auVar23[0] = -(cStack_245 == 'e');
              auVar23[1] = -(cStack_244 == 'i');
              auVar23[2] = -(cStack_243 == 'c');
              auVar23[3] = -(cStack_242 == 'n');
              auVar23[4] = -(cStack_241 == 'y');
              auVar23[5] = -(cStack_240 == 'j');
              auVar23[6] = -(cStack_23f == 'q');
              auVar23[7] = -(cStack_23e == 'p');
              auVar23[8] = -(cStack_23d == 'v');
              auVar23[9] = -(cStack_23c == 'o');
              auVar23[10] = -(cStack_23b == 'z');
              auVar23[0xb] = -(cStack_23a == 'x');
              auVar23[0xc] = -(cStack_239 == 'm');
              auVar23[0xd] = -(cStack_238 == 'b');
              auVar23[0xe] = -(cStack_237 == 't');
              auVar23[0xf] = -(abStack_236[0] == '\0');
              auVar19[0] = -(local_248 == 0x73);
              auVar19[1] = -(bStack_247 == 0x68);
              auVar19[2] = -(cStack_246 == 'r');
              auVar19[3] = -(cStack_245 == 'e');
              auVar19[4] = -(cStack_244 == 'i');
              auVar19[5] = -(cStack_243 == 'c');
              auVar19[6] = -(cStack_242 == 'n');
              auVar19[7] = -(cStack_241 == 'y');
              auVar19[8] = -(cStack_240 == 'j');
              auVar19[9] = -(cStack_23f == 'q');
              auVar19[10] = -(cStack_23e == 'p');
              auVar19[0xb] = -(cStack_23d == 'v');
              auVar19[0xc] = -(cStack_23c == 'o');
              auVar19[0xd] = -(cStack_23b == 'z');
              auVar19[0xe] = -(cStack_23a == 'x');
              auVar19[0xf] = -(cStack_239 == 'm');
              auVar19 = auVar19 & auVar23;
              if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) {
                TEST_RESULTS = TEST_RESULTS + 1;
                printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
                       ,0xb0,"strcmp( s, presort ) == 0");
              }
              auVar20[0] = -(local_248 == 0x73);
              auVar20[1] = -(bStack_247 == 0x68);
              auVar20[2] = -(cStack_246 == 'r');
              auVar20[3] = -(cStack_245 == 'e');
              auVar20[4] = -(cStack_244 == 'i');
              auVar20[5] = -(cStack_243 == 'c');
              auVar20[6] = -(cStack_242 == 'n');
              auVar20[7] = -(cStack_241 == 'y');
              auVar20[8] = -(cStack_240 == 'j');
              auVar20[9] = -(cStack_23f == 'q');
              auVar20[10] = -(cStack_23e == 'p');
              auVar20[0xb] = -(cStack_23d == 'v');
              auVar20[0xc] = -(cStack_23c == 'o');
              auVar20[0xd] = -(cStack_23b == 'z');
              auVar20[0xe] = -(cStack_23a == 'x');
              auVar20[0xf] = -(cStack_239 == 'm');
              auVar24[0] = -(cStack_245 == 'e');
              auVar24[1] = -(cStack_244 == 'i');
              auVar24[2] = -(cStack_243 == 'c');
              auVar24[3] = -(cStack_242 == 'n');
              auVar24[4] = -(cStack_241 == 'y');
              auVar24[5] = -(cStack_240 == 'j');
              auVar24[6] = -(cStack_23f == 'q');
              auVar24[7] = -(cStack_23e == 'p');
              auVar24[8] = -(cStack_23d == 'v');
              auVar24[9] = -(cStack_23c == 'o');
              auVar24[10] = -(cStack_23b == 'z');
              auVar24[0xb] = -(cStack_23a == 'x');
              auVar24[0xc] = -(cStack_239 == 'm');
              auVar24[0xd] = -(cStack_238 == 'b');
              auVar24[0xe] = -(cStack_237 == 't');
              auVar24[0xf] = -(abStack_236[0] == 0);
              auVar20 = auVar20 & auVar24;
              if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
                TEST_RESULTS = TEST_RESULTS + 1;
                printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
                       ,0xb7,"strcmp( s, presort ) == 0");
              }
              return TEST_RESULTS;
            }
            puVar6 = puVar7 + -2;
            pbVar4 = (byte *)puVar7[-2];
            pbVar5 = (byte *)puVar7[-1];
          } while( true );
        }
        puVar6 = puVar7 + -2;
        pbVar4 = (byte *)puVar7[-2];
        pbVar5 = (byte *)puVar7[-1];
      } while( true );
    }
    puVar6 = puVar7 + -2;
    pbVar4 = (byte *)puVar7[-2];
    pbVar9 = (byte *)puVar7[-1];
  } while( true );
}

Assistant:

int main( void )
{
    char presort[] = { "shreicnyjqpvozxmbt" };
    char sorted1[] = { "bcehijmnopqrstvxyz" };
    char sorted2[] = { "bticjqnyozpvreshxm" };
    char s[19];
    strcpy( s, presort );
    qsort( s, 18, 1, compare );
    TESTCASE( strcmp( s, sorted1 ) == 0 );
    strcpy( s, presort );
    qsort( s, 9, 2, compare );
    TESTCASE( strcmp( s, sorted2 ) == 0 );
    strcpy( s, presort );
    qsort( s, 1, 1, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#if defined( REGTEST ) && ( defined( __BSD_VISIBLE ) || defined( __APPLE__ ) )
    puts( "qsort.c: Skipping test #4 for BSD as it goes into endless loop here." );
#elif defined( REGTEST ) && defined( __ANDROID__ )
    puts( "qsort.c: Skipping test #4 for Android as it crashes." );
#else
    qsort( s, 100, 0, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#endif
    return TEST_RESULTS;
}